

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O0

BucketSet * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::getIntersectingNonstrict
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *lt,Bucket *rt,Type type)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  reference this_00;
  iterator in_RDI;
  Type in_R8D;
  insert_iterator<std::map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>_>
  iVar6;
  Bucket *b;
  pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations> *pair;
  iterator __end3;
  iterator __begin3;
  RelationsMap *__range3;
  RelationsMap result;
  RelationsMap rtLE;
  RelationsMap ltGE;
  BucketSet *other;
  undefined4 in_stack_fffffffffffffe88;
  Type in_stack_fffffffffffffe8c;
  _Self local_138;
  _Self local_130;
  undefined1 *local_128;
  undefined1 local_119;
  insert_iterator<std::map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>_>
  local_118;
  undefined8 in_stack_ffffffffffffff00;
  undefined1 toFirstStrict;
  undefined1 in_stack_ffffffffffffff08 [16];
  RelationsGraph<dg::vr::ValueRelations> *in_stack_ffffffffffffff18;
  undefined1 local_c8 [48];
  undefined1 local_98 [56];
  undefined1 local_60 [60];
  Type local_24;
  
  toFirstStrict = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
  local_24 = in_R8D;
  memset(local_60,0,8);
  Relations::Relations((Relations *)0x1e6137);
  Relations::set((Relations *)in_RDI._M_node,in_stack_fffffffffffffe8c,
                 SUB41((uint)in_stack_fffffffffffffe88 >> 0x18,0));
  getRelated(in_stack_ffffffffffffff18,in_stack_ffffffffffffff08._8_8_,
             in_stack_ffffffffffffff08._0_8_,(bool)toFirstStrict);
  memset(local_98,0,8);
  Relations::Relations((Relations *)0x1e619b);
  dg::vr::Relations::inverted(local_24);
  Relations::set((Relations *)in_RDI._M_node,in_stack_fffffffffffffe8c,
                 SUB41((uint)in_stack_fffffffffffffe88 >> 0x18,0));
  getRelated(in_stack_ffffffffffffff18,in_stack_ffffffffffffff08._8_8_,
             in_stack_ffffffffffffff08._0_8_,(bool)toFirstStrict);
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
         *)0x1e61e5);
  iVar2 = std::
          map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          ::begin((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  iVar3 = std::
          map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          ::end((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  iVar4 = std::
          map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          ::begin((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  iVar5 = std::
          map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          ::end((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::begin((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
           *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  iVar6 = std::
          inserter<std::map<std::reference_wrapper<dg::vr::Bucket_const>,dg::vr::Relations,std::less<std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>>>
                    ((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),in_RDI);
  local_118 = std::
              set_intersection<std::_Rb_tree_iterator<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>,std::_Rb_tree_iterator<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>,std::insert_iterator<std::map<std::reference_wrapper<dg::vr::Bucket_const>,dg::vr::Relations,std::less<std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>>>,dg::vr::RelationsGraph<dg::vr::ValueRelations>::getIntersectingNonstrict(dg::vr::Bucket_const&,dg::vr::Bucket_const&,dg::vr::Relations::Type)::_lambda(std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>&,std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>&)_1_>
                        (iVar2._M_node,iVar3._M_node,iVar4._M_node,iVar5._M_node,iVar6.container,
                         iVar6.iter._M_node._M_node);
  local_119 = 0;
  VectorSet<std::reference_wrapper<dg::vr::Bucket>_>::VectorSet
            ((VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *)0x1e62bb);
  local_128 = local_c8;
  local_130._M_node =
       (_Base_ptr)
       std::
       map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
       ::begin((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_138._M_node =
       (_Base_ptr)
       std::
       map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
       ::end((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
              *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  while (bVar1 = std::operator!=(&local_130,&local_138), bVar1) {
    this_00 = std::
              _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
              ::operator*((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                           *)0x1e6305);
    std::reference_wrapper<const_dg::vr::Bucket>::get(&this_00->first);
    VectorSet<std::reference_wrapper<dg::vr::Bucket>>::sure_emplace<dg::vr::Bucket&>
              ((VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *)in_RDI._M_node,
               (Bucket *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::
    _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                  *)in_RDI._M_node);
  }
  local_119 = 1;
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          *)0x1e6357);
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          *)0x1e6364);
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          *)0x1e6371);
  return (BucketSet *)in_RDI._M_node;
}

Assistant:

Bucket::BucketSet getIntersectingNonstrict(const Bucket &lt,
                                               const Bucket &rt,
                                               Relations::Type type) {
        assert(type == Relations::SGE || type == Relations::UGE);
        assert(areRelated(lt, type, rt));
        RelationsMap ltGE = getRelated(lt, Relations().set(type));
        RelationsMap rtLE =
                getRelated(rt, Relations().set(Relations::inverted(type)));

        RelationsMap result;
        std::set_intersection(ltGE.begin(), ltGE.end(), rtLE.begin(),
                              rtLE.end(), std::inserter(result, result.begin()),
                              [](RelationsMap::value_type &ltPair,
                                 RelationsMap::value_type &rtPair) {
                                  return ltPair.first < rtPair.first;
                              });

        Bucket::BucketSet other;
        for (auto &pair : result) {
            Bucket &b = const_cast<Bucket &>(pair.first.get());
            assert(!other.contains(b));
            other.sure_emplace(b);
        }

        return other;
    }